

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.c
# Opt level: O0

json_object * json_object_get(json_object *jso)

{
  json_object *jso_local;
  
  if (jso != (json_object *)0x0) {
    if (jso->_ref_count == 0xffffffff) {
      __assert_fail("jso->_ref_count < UINT32_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/json_object.c"
                    ,0x105,"struct json_object *json_object_get(struct json_object *)");
    }
    jso->_ref_count = jso->_ref_count + 1;
  }
  return jso;
}

Assistant:

struct json_object *json_object_get(struct json_object *jso)
{
	if (!jso)
		return jso;

	// Don't overflow the refcounter.
	assert(jso->_ref_count < UINT32_MAX);

#if defined(HAVE_ATOMIC_BUILTINS) && defined(ENABLE_THREADING)
	__sync_add_and_fetch(&jso->_ref_count, 1);
#else
	++jso->_ref_count;
#endif

	return jso;
}